

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

ZoneState * QDateTimePrivate::localStateAtMillis(qint64 millis,TransitionOptions resolve)

{
  long lVar1;
  bool bVar2;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar3;
  long lVar4;
  longlong lVar5;
  long in_RSI;
  ZoneState *in_RDI;
  long in_FS_OFFSET;
  R_conflict5 RVar6;
  ZoneState *result;
  qint64 adjusted;
  R_conflict5 fake;
  qint64 in_stack_ffffffffffffff88;
  qint64 in_stack_ffffffffffffff90;
  ZoneState *local;
  longlong in_stack_ffffffffffffffc0;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  longlong lVar7;
  
  resolve_00.i = (Int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local = in_RDI;
  bVar2 = millisInSystemRange(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar2) {
    in_RDI->when = -0x5555555555555556;
    in_RDI->offset = -0x55555556;
    in_RDI->dst = 0xaaaaaaaa;
    *(undefined8 *)&in_RDI->valid = 0xaaaaaaaaaaaaaaaa;
    QLocalTime::mapLocalTime((qint64)local,(TransitionOptions)resolve_00.i);
    if ((in_RDI->valid & 1U) != 0) goto LAB_00162217;
  }
  RVar6 = millisToWithinRange((qint64)in_RDI);
  lVar4 = RVar6.shifted;
  if (((undefined1  [16])RVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ZoneState::ZoneState(in_RDI,in_RSI);
  }
  else {
    in_RDI->when = -0x5555555555555556;
    in_RDI->offset = -0x55555556;
    in_RDI->dst = 0xaaaaaaaa;
    *(undefined8 *)&in_RDI->valid = 0xaaaaaaaaaaaaaaaa;
    QLocalTime::mapLocalTime((qint64)local,(TransitionOptions)resolve_00.i);
    if ((in_RDI->valid & 1U) == 0) {
      in_RDI->when = in_RSI;
    }
    else {
      lVar7 = -0x5555555555555556;
      eVar3 = qAddOverflow<long_long>
                        (in_RDI->when,in_RSI - lVar4,(longlong *)&stack0xffffffffffffffc0);
      if (eVar3) {
        lVar5 = std::numeric_limits<long_long>::min();
        lVar7 = std::numeric_limits<long_long>::max();
        if (in_RSI < lVar4) {
          lVar7 = lVar5;
        }
      }
      in_RDI->when = lVar7;
    }
  }
LAB_00162217:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local;
}

Assistant:

QDateTimePrivate::ZoneState QDateTimePrivate::localStateAtMillis(
    qint64 millis, QDateTimePrivate::TransitionOptions resolve)
{
    // First, if millis is within a day of the viable range, try mktime() in
    // case it does fall in the range and gets useful information:
    if (millisInSystemRange(millis, MSECS_PER_DAY)) {
        auto result = QLocalTime::mapLocalTime(millis, resolve);
        if (result.valid)
            return result;
    }

    // Otherwise, outside the system range.
#if QT_CONFIG(timezone)
    // Use the system zone:
    const auto sys = QTimeZone::systemTimeZone();
    if (sys.isValid())
        return zoneStateAtMillis(sys, millis, resolve);
#endif // timezone

    // Kludge
    // Use a time in the system range with the same day-of-week pattern to its year:
    auto fake = millisToWithinRange(millis);
    if (Q_LIKELY(fake.good)) {
        auto result = QLocalTime::mapLocalTime(fake.shifted, resolve);
        if (result.valid) {
            qint64 adjusted;
            if (Q_UNLIKELY(qAddOverflow(result.when, millis - fake.shifted, &adjusted))) {
                using Bound = std::numeric_limits<qint64>;
                adjusted = millis < fake.shifted ? Bound::min() : Bound::max();
            }
            result.when = adjusted;
        } else {
            result.when = millis;
        }
        return result;
    }
    // Overflow, apparently.
    return {millis};
}